

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::SetProgram(GLContextState *this,GLProgramObj *GLProgram)

{
  bool bVar1;
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  GLenum err;
  GLuint GLProgHandle;
  GLProgramObj *GLProgram_local;
  GLContextState *this_local;
  
  msg.field_2._12_4_ = 0;
  bVar1 = UpdateBoundObject<GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLProgramObjCreateReleaseHelper>>
                    (&this->m_GLProgId,GLProgram,(GLuint *)(msg.field_2._M_local_buf + 0xc));
  if (bVar1) {
    (*__glewUseProgram)(msg.field_2._12_4_);
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[25],char[17],unsigned_int>
                (false,"SetProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x95,(char (*) [25])"Failed to set GL program",(char (*) [17])"\nGL Error Code: ",
                 (uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_40,(char (*) [6])0x4585f6);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"SetProgram",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x95);
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  return;
}

Assistant:

void GLContextState::SetProgram(const GLProgramObj& GLProgram)
{
    GLuint GLProgHandle = 0;
    if (UpdateBoundObject(m_GLProgId, GLProgram, GLProgHandle))
    {
        glUseProgram(GLProgHandle);
        DEV_CHECK_GL_ERROR("Failed to set GL program");
    }
}